

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecProtocol.cpp
# Opt level: O3

char * HdmiCec::GetFrameTypeString(FrameType type)

{
  if (type < (FrameType_EOM|FrameType_OpCode)) {
    return &DAT_0010b514 + *(int *)(&DAT_0010b514 + (ulong)type * 4);
  }
  return "Invalid";
}

Assistant:

const char* GetFrameTypeString( FrameType type )
    {
        switch( type )
        {
        case FrameType_StartSeq:
            return "StartSeq";
        case FrameType_Header:
            return "Header";
        case FrameType_OpCode:
            return "OpCode";
        case FrameType_Operand:
            return "Operand";
        case FrameType_EOM:
            return "EOM";
        case FrameType_ACK:
            return "ACK";
        default:
            break;
        }
        return "Invalid";
    }